

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_data.cpp
# Opt level: O1

void __thiscall duckdb::ErrorData::ErrorData(ErrorData *this,ExceptionType type,string *message)

{
  pointer pcVar1;
  string local_40;
  
  this->initialized = true;
  this->type = type;
  pcVar1 = (message->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + message->_M_string_length);
  SanitizeErrorMessage(&this->raw_message,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  ConstructFinalMessage_abi_cxx11_(&this->final_message,this);
  (this->extra_info)._M_h._M_buckets = &(this->extra_info)._M_h._M_single_bucket;
  (this->extra_info)._M_h._M_bucket_count = 1;
  (this->extra_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extra_info)._M_h._M_element_count = 0;
  (this->extra_info)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extra_info)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extra_info)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

ErrorData::ErrorData(ExceptionType type, const string &message)
    : initialized(true), type(type), raw_message(SanitizeErrorMessage(message)),
      final_message(ConstructFinalMessage()) {
}